

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O2

string * Corrade::Utility::Directory::current_abi_cxx11_(void)

{
  String *other;
  string *in_RDI;
  Optional<Corrade::Containers::String> out;
  string local_50;
  Optional<Corrade::Containers::String> local_30;
  
  Path::currentDirectory();
  if (local_30._set == true) {
    other = Containers::Optional<Corrade::Containers::String>::operator*(&local_30);
    Containers::Implementation::
    StringConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::to(&local_50,other);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      (in_RDI->field_2)._M_allocated_capacity =
           CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,local_50.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_50.field_2._8_8_;
    }
    else {
      (in_RDI->_M_dataplus)._M_p = local_50._M_dataplus._M_p;
      (in_RDI->field_2)._M_allocated_capacity =
           CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,local_50.field_2._M_local_buf[0]);
    }
    in_RDI->_M_string_length = local_50._M_string_length;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
  }
  Containers::Optional<Corrade::Containers::String>::~Optional(&local_30);
  return in_RDI;
}

Assistant:

std::string current() {
    Containers::Optional<Containers::String> out = Path::currentDirectory();
    return out ? std::string{*out} : std::string{};
}